

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# X86ATTInstPrinter.c
# Opt level: O1

void printMemReference(MCInst *MI,uint Op,SStream *O)

{
  uint8_t *puVar1;
  cs_detail *pcVar2;
  _Bool _Var3;
  uint uVar4;
  MCOperand *op;
  MCOperand *pMVar5;
  int64_t iVar6;
  MCOperand *op_00;
  MCOperand *op_01;
  ulong uVar7;
  ulong uVar8;
  char *fmt;
  bool bVar9;
  
  op = MCInst_getOperand(MI,Op);
  pMVar5 = MCInst_getOperand(MI,Op + 1);
  iVar6 = MCOperand_getImm(pMVar5);
  pMVar5 = MCInst_getOperand(MI,Op + 2);
  op_00 = MCInst_getOperand(MI,Op + 3);
  op_01 = MCInst_getOperand(MI,Op + 4);
  if (MI->csh->detail != CS_OPT_OFF) {
    pcVar2 = MI->flat_insn->detail;
    puVar1 = pcVar2->groups + (ulong)((uint)(pcVar2->field_6).x86.op_count * 0x30) + 0x3e;
    puVar1[0] = '\x03';
    puVar1[1] = '\0';
    puVar1[2] = '\0';
    puVar1[3] = '\0';
    pcVar2 = MI->flat_insn->detail;
    pcVar2->groups[(ulong)((uint)(pcVar2->field_6).x86.op_count * 0x30) + 0x5e] = MI->x86opsize;
    pcVar2 = MI->flat_insn->detail;
    puVar1 = pcVar2->groups + (ulong)((uint)(pcVar2->field_6).x86.op_count * 0x30) + 0x46;
    puVar1[0] = '\0';
    puVar1[1] = '\0';
    puVar1[2] = '\0';
    puVar1[3] = '\0';
    uVar4 = MCOperand_getReg(op);
    pcVar2 = MI->flat_insn->detail;
    *(uint *)(pcVar2->groups + (ulong)((uint)(pcVar2->field_6).x86.op_count * 0x30) + 0x4a) = uVar4;
    uVar4 = MCOperand_getReg(pMVar5);
    pcVar2 = MI->flat_insn->detail;
    *(uint *)(pcVar2->groups + (ulong)((uint)(pcVar2->field_6).x86.op_count * 0x30) + 0x4e) = uVar4;
    pcVar2 = MI->flat_insn->detail;
    *(int *)(pcVar2->groups + (ulong)((uint)(pcVar2->field_6).x86.op_count * 0x30) + 0x52) =
         (int)iVar6;
    pcVar2 = MI->flat_insn->detail;
    puVar1 = pcVar2->groups + (ulong)((uint)(pcVar2->field_6).x86.op_count * 0x30) + 0x56;
    puVar1[0] = '\0';
    puVar1[1] = '\0';
    puVar1[2] = '\0';
    puVar1[3] = '\0';
    puVar1[4] = '\0';
    puVar1[5] = '\0';
    puVar1[6] = '\0';
    puVar1[7] = '\0';
  }
  uVar4 = MCOperand_getReg(op_01);
  if (uVar4 != 0) {
    _printOperand(MI,Op + 4,O);
    if (MI->csh->detail != CS_OPT_OFF) {
      pcVar2 = MI->flat_insn->detail;
      *(uint *)(pcVar2->groups + (ulong)((uint)(pcVar2->field_6).x86.op_count * 0x30) + 0x46) =
           uVar4;
    }
    SStream_concat0(O,":");
  }
  SStream_concat0(O,"[");
  uVar4 = MCOperand_getReg(op);
  bVar9 = uVar4 != 0;
  if (bVar9) {
    _printOperand(MI,Op,O);
  }
  uVar4 = MCOperand_getReg(pMVar5);
  if (uVar4 != 0) {
    if (bVar9) {
      SStream_concat0(O," + ");
    }
    _printOperand(MI,Op + 2,O);
    bVar9 = true;
    if (iVar6 != 1) {
      SStream_concat(O,"*%u");
    }
  }
  _Var3 = MCOperand_isImm(op_00);
  if (_Var3) {
    uVar7 = MCOperand_getImm(op_00);
    if (MI->csh->detail != CS_OPT_OFF) {
      pcVar2 = MI->flat_insn->detail;
      *(ulong *)(pcVar2->groups + (ulong)((uint)(pcVar2->field_6).x86.op_count * 0x30) + 0x56) =
           uVar7;
    }
    if (uVar7 == 0) {
      if (!bVar9) {
        SStream_concat0(O,"0");
      }
    }
    else {
      uVar8 = uVar7;
      if (bVar9) {
        if ((long)uVar7 < 0) {
          uVar8 = -uVar7;
          if ((long)uVar7 < -9) {
            fmt = " - 0x%lx";
          }
          else {
            fmt = " - %lu";
          }
        }
        else if ((long)uVar7 < 10) {
          fmt = " + %lu";
        }
        else {
          fmt = " + 0x%lx";
        }
      }
      else if ((long)uVar7 < 0) {
        uVar8 = arch_masks[MI->csh->mode] & uVar7;
        fmt = "0x%lx";
      }
      else if ((long)uVar7 < 10) {
        fmt = "%lu";
      }
      else {
        fmt = "0x%lx";
      }
      SStream_concat(O,fmt,uVar8);
    }
  }
  SStream_concat0(O,"]");
  if (MI->csh->detail != CS_OPT_OFF) {
    puVar1 = &(MI->flat_insn->detail->field_6).x86.op_count;
    *puVar1 = *puVar1 + '\x01';
  }
  if (MI->op1_size == '\0') {
    MI->op1_size = MI->x86opsize;
  }
  return;
}

Assistant:

static void printMemReference(MCInst *MI, unsigned Op, SStream *O)
{
	MCOperand *BaseReg  = MCInst_getOperand(MI, Op + X86_AddrBaseReg);
	MCOperand *IndexReg  = MCInst_getOperand(MI, Op + X86_AddrIndexReg);
	MCOperand *DispSpec = MCInst_getOperand(MI, Op + X86_AddrDisp);
	MCOperand *SegReg = MCInst_getOperand(MI, Op + X86_AddrSegmentReg);
	uint64_t ScaleVal;
	int reg;

	if (MI->csh->detail) {
		MI->flat_insn->detail->x86.operands[MI->flat_insn->detail->x86.op_count].type = X86_OP_MEM;
		MI->flat_insn->detail->x86.operands[MI->flat_insn->detail->x86.op_count].size = MI->x86opsize;
		MI->flat_insn->detail->x86.operands[MI->flat_insn->detail->x86.op_count].mem.segment = X86_REG_INVALID;
		MI->flat_insn->detail->x86.operands[MI->flat_insn->detail->x86.op_count].mem.base = MCOperand_getReg(BaseReg);
		MI->flat_insn->detail->x86.operands[MI->flat_insn->detail->x86.op_count].mem.index = MCOperand_getReg(IndexReg);
		MI->flat_insn->detail->x86.operands[MI->flat_insn->detail->x86.op_count].mem.scale = 1;
		MI->flat_insn->detail->x86.operands[MI->flat_insn->detail->x86.op_count].mem.disp = 0;
	}

	// If this has a segment register, print it.
	reg = MCOperand_getReg(SegReg);
	if (reg) {
		_printOperand(MI, Op + X86_AddrSegmentReg, O);
		if (MI->csh->detail) {
			MI->flat_insn->detail->x86.operands[MI->flat_insn->detail->x86.op_count].mem.segment = reg;
		}

		SStream_concat0(O, ":");
	}

	if (MCOperand_isImm(DispSpec)) {
		int64_t DispVal = MCOperand_getImm(DispSpec);
		if (MI->csh->detail)
			MI->flat_insn->detail->x86.operands[MI->flat_insn->detail->x86.op_count].mem.disp = DispVal;
		if (DispVal) {
			if (MCOperand_getReg(IndexReg) || MCOperand_getReg(BaseReg)) {
				if (DispVal < 0) {
					if (DispVal <  -HEX_THRESHOLD)
						SStream_concat(O, "-0x%"PRIx64, -DispVal);
					else
						SStream_concat(O, "-%"PRIu64, -DispVal);
				} else {
					if (DispVal > HEX_THRESHOLD)
						SStream_concat(O, "0x%"PRIx64, DispVal);
					else
						SStream_concat(O, "%"PRIu64, DispVal);
				}
			} else {
				// only immediate as address of memory
				if (DispVal < 0) {
					SStream_concat(O, "0x%"PRIx64, arch_masks[MI->csh->mode] & DispVal);
				} else {
					if (DispVal > HEX_THRESHOLD)
						SStream_concat(O, "0x%"PRIx64, DispVal);
					else
						SStream_concat(O, "%"PRIu64, DispVal);
				}
			}
		}
	}

	if (MCOperand_getReg(IndexReg) || MCOperand_getReg(BaseReg)) {
		SStream_concat0(O, "(");

		if (MCOperand_getReg(BaseReg))
			_printOperand(MI, Op + X86_AddrBaseReg, O);

		if (MCOperand_getReg(IndexReg)) {
			SStream_concat0(O, ", ");
			_printOperand(MI, Op + X86_AddrIndexReg, O);
			ScaleVal = MCOperand_getImm(MCInst_getOperand(MI, Op + X86_AddrScaleAmt));
			if (MI->csh->detail)
				MI->flat_insn->detail->x86.operands[MI->flat_insn->detail->x86.op_count].mem.scale = (int)ScaleVal;
			if (ScaleVal != 1) {
				SStream_concat(O, ", %u", ScaleVal);
			}
		}
		SStream_concat0(O, ")");
	}

	if (MI->csh->detail)
		MI->flat_insn->detail->x86.op_count++;
}